

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition-optimizer.hxx
# Opt level: O0

Move * __thiscall
lineage::heuristics::
PartitionOptimizerBase<lineage::heuristics::branching::HungarianBranching<lineage::heuristics::PartitionGraph>_>
::proposeSingleMove(PartitionOptimizerBase<lineage::heuristics::branching::HungarianBranching<lineage::heuristics::PartitionGraph>_>
                    *this,size_t vertex,size_t other)

{
  value_type vVar1;
  value_type vVar2;
  uint uVar3;
  reference pvVar4;
  size_type in_RCX;
  size_type in_RDX;
  long *in_RSI;
  Move *in_RDI;
  double __value;
  double localBranchingObj_00;
  double dVar5;
  double branchingObj;
  double dVar6;
  double dLocalBranchingObj;
  double localBranchingObj;
  double dObj;
  size_t targetPartition;
  size_t previousPartition;
  size_t in_stack_000002a8;
  size_t in_stack_000002b0;
  PartitionGraph *in_stack_000002b8;
  size_t in_stack_ffffffffffffff90;
  size_t in_stack_ffffffffffffff98;
  Move *in_stack_ffffffffffffffa0;
  
  pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RSI + 0x16),
                      in_RDX);
  vVar1 = *pvVar4;
  pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RSI + 0x16),
                      in_RCX);
  vVar2 = *pvVar4;
  __value = PartitionGraph::move(in_stack_000002b8,in_stack_000002b0,in_stack_000002a8);
  uVar3 = std::isinf(__value);
  if ((uVar3 & 1) == 0) {
    localBranchingObj_00 = (double)(**(code **)(*in_RSI + 0x18))(in_RSI,vVar1,vVar2);
    dVar5 = localBranchingObj_00 - (double)in_RSI[0x1c];
    PartitionGraph::move(in_stack_000002b8,in_stack_000002b0,in_stack_000002a8);
    branchingObj = (double)in_RSI[0x1a] + dVar5;
    dVar6 = (double)(**(code **)(*in_RSI + 0x10))();
    Move::Move(in_RDI,in_RDX,in_RCX,localBranchingObj_00,branchingObj,dVar6 + dVar5 + __value);
  }
  else {
    Move::Move(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  }
  return in_RDI;
}

Assistant:

inline typename PartitionOptimizerBase<BROPT>::Move
PartitionOptimizerBase<BROPT>::proposeSingleMove(const size_t vertex,
                                                 const size_t other)
{
    const size_t previousPartition = partitionGraph_.vertexLabels_[vertex];
    const size_t targetPartition = partitionGraph_.vertexLabels_[other];

    // apply move.
    auto dObj = partitionGraph_.move(vertex, targetPartition);

    // if the move is not possible we can stop.
    // Note that partitionGraph::move does not move if its not feasible,
    // so we dont have to undo anything.
    if (std::isinf(dObj)) {
        return { vertex, other };
    }

    // Optimize branching to get best possible objective after the move.
    const auto localBranchingObj =
        solveLocalBranchingProblem(previousPartition, targetPartition);

    const auto dLocalBranchingObj =
        (localBranchingObj - localBranchingObjective_);
    dObj += dLocalBranchingObj;

    // and undo move.
    partitionGraph_.move(vertex, previousPartition);

    return { vertex, other, localBranchingObj,
             branchingObjective_ + dLocalBranchingObj, getObjective() + dObj };
}